

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwitchIRBuilder.cpp
# Opt level: O2

bool __thiscall
SwitchIRBuilder::TestAndAddStringCaseConst(SwitchIRBuilder *this,JITJavascriptString *str)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  StrSwitchCaseList *this_00;
  JITJavascriptString *local_20;
  JITJavascriptString *str_local;
  
  this_00 = this->m_strConstSwitchCases;
  local_20 = str;
  if (this_00 == (StrSwitchCaseList *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/SwitchIRBuilder.cpp"
                       ,0x30f,"(m_strConstSwitchCases)","m_strConstSwitchCases");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    this_00 = this->m_strConstSwitchCases;
  }
  bVar2 = JsUtil::ReadOnlyList<JITJavascriptString_*,_Memory::JitArenaAllocator,_DefaultComparer>::
          Contains(&this_00->
                    super_ReadOnlyList<JITJavascriptString_*,_Memory::JitArenaAllocator,_DefaultComparer>
                   ,&local_20);
  if (!bVar2) {
    JsUtil::
    List<JITJavascriptString_*,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::Add(this->m_strConstSwitchCases,&local_20);
  }
  return bVar2;
}

Assistant:

bool
SwitchIRBuilder::TestAndAddStringCaseConst(JITJavascriptString * str)
{
    Assert(m_strConstSwitchCases);

    if (m_strConstSwitchCases->Contains(str))
    {
        return true;
    }
    else
    {
        m_strConstSwitchCases->Add(str);
        return false;
    }
}